

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O0

VkAllocationCallbacks *
vk::makeCallbacks(VkAllocationCallbacks *__return_storage_ptr__,AllocationCallbacks *object)

{
  AllocationCallbacks *object_local;
  
  __return_storage_ptr__->pUserData = object;
  __return_storage_ptr__->pfnAllocation = allocationCallback;
  __return_storage_ptr__->pfnReallocation = reallocationCallback;
  __return_storage_ptr__->pfnFree = freeCallback;
  __return_storage_ptr__->pfnInternalAllocation = internalAllocationNotificationCallback;
  __return_storage_ptr__->pfnInternalFree = internalFreeNotificationCallback;
  return __return_storage_ptr__;
}

Assistant:

static VkAllocationCallbacks makeCallbacks (AllocationCallbacks* object)
{
	const VkAllocationCallbacks callbacks =
	{
		reinterpret_cast<void*>(object),
		allocationCallback,
		reallocationCallback,
		freeCallback,
		internalAllocationNotificationCallback,
		internalFreeNotificationCallback
	};
	return callbacks;
}